

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall
Js::BufferWriter::WriteArray<Js::ImplicitCallFlags_const>
          (BufferWriter *this,ImplicitCallFlags *data,size_t len)

{
  bool bVar1;
  size_t size;
  size_t len_local;
  ImplicitCallFlags *data_local;
  BufferWriter *this_local;
  
  bVar1 = len <= this->lengthLeft;
  if (bVar1) {
    memcpy_s(this->current,len,data,len);
    this->current = this->current + len;
    this->lengthLeft = this->lengthLeft - len;
  }
  return bVar1;
}

Assistant:

bool WriteArray(__in_ecount(len) T * data, size_t len)
        {
            size_t size = sizeof(T) * len;
            if (lengthLeft < size)
            {
                return false;
            }
            memcpy_s(current, size, data, size);
            current += size;
            lengthLeft -= size;
            return true;
        }